

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_tree.cpp
# Opt level: O1

match_result_t * __thiscall
zmq::radix_tree_t::match
          (match_result_t *__return_storage_ptr__,radix_tree_t *this,uchar *key_,size_t key_size_,
          bool is_lookup_)

{
  uint uVar1;
  bool bVar2;
  node_t nVar3;
  uchar uVar4;
  ulong uVar5;
  node_t nVar6;
  size_t sVar7;
  size_t index_;
  size_t sVar8;
  uchar *puVar9;
  node_t nVar10;
  size_t prefix_bytes_matched_;
  size_t key_bytes_matched_;
  node_t current_node;
  size_t local_60;
  node_t local_58;
  
  if (key_ == (uchar *)0x0) {
    match();
  }
  current_node._data = (this->_root)._data;
  local_60 = 0;
  prefix_bytes_matched_ = 0;
  key_bytes_matched_ = 0;
  sVar7 = 0;
  puVar9 = current_node._data;
  local_58._data = current_node._data;
  do {
    nVar3._data = current_node._data;
    uVar5 = (ulong)*(uint *)(current_node._data + 4);
    sVar8 = sVar7;
    nVar10._data = puVar9;
    if ((uVar5 == 0) && (*(int *)(current_node._data + 8) == 0)) break;
    if ((uVar5 == 0) || (key_size_ <= key_bytes_matched_)) {
      prefix_bytes_matched_ = 0;
    }
    else {
      prefix_bytes_matched_ = 0;
      while (current_node._data[prefix_bytes_matched_ + 0xc] == key_[key_bytes_matched_]) {
        prefix_bytes_matched_ = prefix_bytes_matched_ + 1;
        key_bytes_matched_ = key_bytes_matched_ + 1;
        if ((uVar5 <= prefix_bytes_matched_) || (key_size_ <= key_bytes_matched_)) break;
      }
    }
    if ((prefix_bytes_matched_ == uVar5 && is_lookup_) && (*(int *)current_node._data != 0)) {
      bVar2 = false;
      key_bytes_matched_ = key_size_;
    }
    else {
      if (key_bytes_matched_ != key_size_ && prefix_bytes_matched_ == uVar5) {
        uVar1 = *(uint *)(current_node._data + 8);
        nVar6._data = nVar3._data;
        if ((ulong)uVar1 != 0) {
          index_ = 0;
          do {
            uVar4 = node_t::first_byte_at(&current_node,index_);
            if (uVar4 == key_[key_bytes_matched_]) {
              nVar6 = node_t::node_at(&current_node,index_);
              sVar8 = index_;
              local_60 = sVar7;
              break;
            }
            index_ = index_ + 1;
          } while (uVar1 != index_);
        }
        if (nVar6._data != nVar3._data) {
          bVar2 = true;
          nVar10._data = nVar3._data;
          current_node._data = nVar6._data;
          local_58._data = puVar9;
          goto LAB_0019e391;
        }
      }
      bVar2 = false;
    }
LAB_0019e391:
    sVar7 = sVar8;
    puVar9 = nVar10._data;
  } while (bVar2);
  match_result_t::match_result_t
            (__return_storage_ptr__,key_bytes_matched_,prefix_bytes_matched_,sVar8,local_60,
             current_node,nVar10,local_58);
  return __return_storage_ptr__;
}

Assistant:

match_result_t zmq::radix_tree_t::match (const unsigned char *key_,
                                         size_t key_size_,
                                         bool is_lookup_ = false) const
{
    zmq_assert (key_);

    // Node we're currently at in the traversal and its predecessors.
    node_t current_node = _root;
    node_t parent_node = current_node;
    node_t grandparent_node = current_node;
    // Index of the next byte to match in the key.
    size_t key_byte_index = 0;
    // Index of the next byte to match in the current node's prefix.
    size_t prefix_byte_index = 0;
    // Index of the edge from parent to current node.
    size_t edge_index = 0;
    // Index of the edge from grandparent to parent.
    size_t parent_edge_index = 0;

    while (current_node.prefix_length () > 0 || current_node.edgecount () > 0) {
        const unsigned char *const prefix = current_node.prefix ();
        const size_t prefix_length = current_node.prefix_length ();

        for (prefix_byte_index = 0;
             prefix_byte_index < prefix_length && key_byte_index < key_size_;
             ++prefix_byte_index, ++key_byte_index) {
            if (prefix[prefix_byte_index] != key_[key_byte_index])
                break;
        }

        // Even if a prefix of the key matches and we're doing a
        // lookup, this means we've found a matching subscription.
        if (is_lookup_ && prefix_byte_index == prefix_length
            && current_node.refcount () > 0) {
            key_byte_index = key_size_;
            break;
        }

        // There was a mismatch or we've matched the whole key, so
        // there's nothing more to do.
        if (prefix_byte_index != prefix_length || key_byte_index == key_size_)
            break;

        // We need to match the rest of the key. Check if there's an
        // outgoing edge from this node.
        node_t next_node = current_node;
        for (size_t i = 0, edgecount = current_node.edgecount (); i < edgecount;
             ++i) {
            if (current_node.first_byte_at (i) == key_[key_byte_index]) {
                parent_edge_index = edge_index;
                edge_index = i;
                next_node = current_node.node_at (i);
                break;
            }
        }

        if (next_node == current_node)
            break; // No outgoing edge.
        grandparent_node = parent_node;
        parent_node = current_node;
        current_node = next_node;
    }

    return match_result_t (key_byte_index, prefix_byte_index, edge_index,
                           parent_edge_index, current_node, parent_node,
                           grandparent_node);
}